

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

void dg::DOD::constructBinaryRelation
               (ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,CDNode *b2,CDNode *b3,CDNode *r1
               ,CDNode *r2)

{
  pointer ppCVar1;
  bool bVar2;
  iterator iVar3;
  _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
  *p_Var4;
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  CDNode *gcur;
  CDNode *local_58;
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  ResultT *local_48;
  ResultT *local_40;
  CDNode *local_38;
  
  this = &(CAp->_rev_mapping)._M_h;
  local_50 = this;
  local_48 = CD;
  local_40 = revCD;
  local_38 = p;
  do {
    local_58 = b2;
    iVar3 = std::
            _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this,&local_58);
    if (iVar3.super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>._M_cur ==
        (__node_type *)0x0) {
      local_58 = (key_type)0x0;
    }
    else {
      local_58 = *(CDNode **)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>
                         ._M_cur + 0x10);
    }
    p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](local_48,&local_58);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_38);
    p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](local_40,&local_38);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_58);
    this = local_50;
    ppCVar1 = (b2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppCVar1 -
        (long)(b2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      b2 = ppCVar1[-1];
    }
    else {
      b2 = (CDNode *)0x0;
    }
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(&CAp->blues,(ulong)b2->_id);
  } while ((!bVar2) &&
          (bVar2 = ADT::
                   SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                   ::get(&CAp->reds,(ulong)b2->_id), !bVar2));
  while( true ) {
    local_58 = r2;
    iVar3 = std::
            _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this,&local_58);
    if (iVar3.super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>._M_cur ==
        (__node_type *)0x0) {
      local_58 = (key_type)0x0;
    }
    else {
      local_58 = *(CDNode **)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<dg::CDNode_*const,_dg::CDNode_*>,_false>
                         ._M_cur + 0x10);
    }
    p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](local_48,&local_58);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_38);
    p_Var4 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](local_40,&local_38);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var4,&local_58);
    ppCVar1 = (r2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppCVar1 -
        (long)(r2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      r2 = ppCVar1[-1];
    }
    else {
      r2 = (CDNode *)0x0;
    }
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(&CAp->blues,(ulong)r2->_id);
    if (bVar2) break;
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(&CAp->reds,(ulong)r2->_id);
    if (bVar2) {
      return;
    }
  }
  return;
}

Assistant:

static void constructBinaryRelation(ColoredAp &CAp, CDNode *p, ResultT &CD,
                                        ResultT &revCD, CDNode *b2, CDNode *b3,
                                        CDNode *r1, CDNode *r2) {
        auto *cur = b2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);
            CD[gcur].insert(p);
            revCD[p].insert(gcur);
            // DBG(cda, p->getID() << " - dod -> " << gcur->getID());
            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == r1);
        (void) r1;

        cur = r2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);
            CD[gcur].insert(p);
            revCD[p].insert(gcur);
            // DBG(cda, p->getID() << " - dod -> " << gcur->getID());
            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == b3);
        (void) b3;
    }